

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

void event_enable_debug_mode(void)

{
  if (event_debug_mode_on_ != 0) {
    event_errx(1,"%s was called twice!","event_enable_debug_mode");
  }
  if (event_debug_mode_too_late != 0) {
    event_errx(1,"%s must be called *before* creating any events or event_bases",
               "event_enable_debug_mode");
  }
  event_debug_mode_on_ = 1;
  event_debug_map_HT_INIT(&global_debug_map);
  return;
}

Assistant:

void
event_enable_debug_mode(void)
{
#ifndef EVENT__DISABLE_DEBUG_MODE
	if (event_debug_mode_on_)
		event_errx(1, "%s was called twice!", __func__);
	if (event_debug_mode_too_late)
		event_errx(1, "%s must be called *before* creating any events "
		    "or event_bases",__func__);

	event_debug_mode_on_ = 1;

	HT_INIT(event_debug_map, &global_debug_map);
#endif
}